

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::createSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,TestParameters params)

{
  undefined1 *this;
  VkInstance pVVar1;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  RefData<vk::Handle<(vk::HandleType)26>_> data_00;
  VkSwapchainKHR VVar2;
  GetPhysicalDeviceGeneratedCommandsPropertiesNVXFunc p_Var3;
  VkInstance_s **ppVVar4;
  Display *nativeDisplay;
  Window *nativeWindow;
  Handle<(vk::HandleType)25> *pHVar5;
  size_type sVar6;
  const_reference pvVar7;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  VkDevice_s **ppVVar9;
  allocator<char> local_a09;
  string local_a08;
  Move<vk::Handle<(vk::HandleType)26>_> local_9e8;
  RefData<vk::Handle<(vk::HandleType)26>_> local_9c8;
  undefined1 local_9a8 [8];
  Unique<vk::Handle<(vk::HandleType)26>_> swapchain;
  unsigned_long local_980;
  MessageBuilder local_978;
  undefined1 auStack_7f8 [8];
  VkSwapchainCreateInfoKHR curParams;
  size_t caseNdx;
  undefined1 local_780 [8];
  vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> cases;
  undefined1 local_760 [8];
  DeviceHelper devHelper;
  RefData<vk::Handle<(vk::HandleType)25>_> local_258;
  undefined1 local_238 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_208;
  undefined1 local_1f8 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  Context *context_local;
  TestParameters params_local;
  
  context_local._0_4_ = params.wsiType;
  this = &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
          m_data.field_0x8;
  instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX =
       (GetPhysicalDeviceGeneratedCommandsPropertiesNVXFunc)context;
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)this,context,(Type)context_local,(VkAllocationCallbacks *)0x0);
  p_Var3 = instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX;
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  NativeObjects::NativeObjects
            ((NativeObjects *)local_1f8,(Context *)p_Var3,(Extensions *)this,(Type)context_local,
             &local_208);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe(&local_208);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar4;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_1f8);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,(Type)context_local,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_258,(Move *)&devHelper.queue);
  data.deleter.m_instanceIface = local_258.deleter.m_instanceIface;
  data.object.m_internal = local_258.object.m_internal;
  data.deleter.m_instance = local_258.deleter.m_instance;
  data.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_238,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue);
  p_Var3 = instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar4;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_238);
  cases.
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar5->m_internal;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_760,(Context *)p_Var3,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,(VkSurfaceKHR)
                    cases.
                    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(VkAllocationCallbacks *)0x0)
  ;
  context_local._4_4_ = params.dimension;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_238);
  generateSwapchainParameterCases
            ((vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *)
             local_780,(Type)context_local,context_local._4_4_,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             (VkPhysicalDevice)local_760,(VkSurfaceKHR)pHVar5->m_internal);
  curParams.oldSwapchain.m_internal = 0;
  while( true ) {
    VVar2.m_internal = curParams.oldSwapchain.m_internal;
    sVar6 = std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            ::size((vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                    *)local_780);
    if (sVar6 <= VVar2.m_internal) break;
    pvVar7 = std::
             vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
             operator[]((vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                         *)local_780,curParams.oldSwapchain.m_internal);
    curParams._88_8_ = (pvVar7->oldSwapchain).m_internal;
    curParams.pQueueFamilyIndices = *(deUint32 **)&pvVar7->preTransform;
    curParams.preTransform = pvVar7->presentMode;
    curParams.compositeAlpha = pvVar7->clipped;
    curParams.imageUsage = pvVar7->queueFamilyIndexCount;
    curParams.imageSharingMode = *(VkSharingMode *)&pvVar7->field_0x44;
    curParams._64_8_ = pvVar7->pQueueFamilyIndices;
    auStack_7f8._0_4_ = pvVar7->sType;
    auStack_7f8._4_4_ = *(undefined4 *)&pvVar7->field_0x4;
    curParams._0_8_ = pvVar7->pNext;
    curParams.pNext = *(void **)&pvVar7->flags;
    curParams._16_8_ = (pvVar7->surface).m_internal;
    curParams.surface.m_internal._0_4_ = pvVar7->minImageCount;
    curParams.surface.m_internal._4_4_ = pvVar7->imageFormat;
    curParams.minImageCount = pvVar7->imageColorSpace;
    curParams.imageFormat = (pvVar7->imageExtent).width;
    curParams._40_8_ = *(undefined8 *)&(pvVar7->imageExtent).height;
    curParams.imageExtent.height = pvVar7->imageUsage;
    curParams.imageArrayLayers = pvVar7->imageSharingMode;
    pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_238);
    curParams._16_8_ = pHVar5->m_internal;
    curParams.imageUsage = 1;
    curParams._64_8_ = &devHelper;
    this_00 = Context::getTestContext
                        ((Context *)
                         instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_978,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_978,(char (*) [10])"Sub-case ");
    local_980 = curParams.oldSwapchain.m_internal + 1;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_980);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])" / ");
    swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::
         size((vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *
              )local_780);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(unsigned_long *)
                               &swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.
                                deleter.m_allocator);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x13c7be4);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(VkSwapchainCreateInfoKHR *)auStack_7f8);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_978);
    ppVVar9 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                        ((RefBase<vk::VkDevice_s_*> *)&devHelper.queueFamilyIndex);
    ::vk::createSwapchainKHR
              (&local_9e8,
               (DeviceInterface *)
               &devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,*ppVVar9
               ,(VkSwapchainCreateInfoKHR *)auStack_7f8,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_9c8,(Move *)&local_9e8);
    data_00.deleter.m_deviceIface = local_9c8.deleter.m_deviceIface;
    data_00.object.m_internal = local_9c8.object.m_internal;
    data_00.deleter.m_device = local_9c8.deleter.m_device;
    data_00.deleter.m_allocator = local_9c8.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)26>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)26>_> *)local_9a8,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::~Move(&local_9e8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)26>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)26>_> *)local_9a8);
    curParams.oldSwapchain.m_internal = curParams.oldSwapchain.m_internal + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"Creating swapchain succeeded",&local_a09);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_a08);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>::~vector
            ((vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *)
             local_780);
  DeviceHelper::~DeviceHelper((DeviceHelper *)local_760);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_238);
  NativeObjects::~NativeObjects((NativeObjects *)local_1f8);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSwapchainTest (Context& context, TestParameters params)
{
	const InstanceHelper					instHelper	(context, params.wsiType);
	const NativeObjects						native		(context, instHelper.supportedExtensions, params.wsiType);
	const Unique<VkSurfaceKHR>				surface		(createSurface(instHelper.vki, *instHelper.instance, params.wsiType, *native.display, *native.window));
	const DeviceHelper						devHelper	(context, instHelper.vki, *instHelper.instance, *surface);
	const vector<VkSwapchainCreateInfoKHR>	cases		(generateSwapchainParameterCases(params.wsiType, params.dimension, instHelper.vki, devHelper.physicalDevice, *surface));

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		VkSwapchainCreateInfoKHR	curParams	= cases[caseNdx];

		curParams.surface				= *surface;
		curParams.queueFamilyIndexCount	= 1u;
		curParams.pQueueFamilyIndices	= &devHelper.queueFamilyIndex;

		context.getTestContext().getLog()
			<< TestLog::Message << "Sub-case " << (caseNdx+1) << " / " << cases.size() << ": " << curParams << TestLog::EndMessage;

		{
			const Unique<VkSwapchainKHR>	swapchain	(createSwapchainKHR(devHelper.vkd, *devHelper.device, &curParams));
		}
	}

	return tcu::TestStatus::pass("Creating swapchain succeeded");
}